

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::FillerParameter::SharedCtor(FillerParameter *this)

{
  this->_cached_size_ = 0;
  (this->type_).ptr_ = (string *)&_default_type__abi_cxx11_;
  this->value_ = 0.0;
  this->min_ = 0.0;
  this->mean_ = 0.0;
  this->variance_norm_ = 0;
  this->sparse_ = -1;
  this->max_ = 1.0;
  this->std_ = 1.0;
  return;
}

Assistant:

void FillerParameter::SharedCtor() {
  _cached_size_ = 0;
  type_.UnsafeSetDefault(&FillerParameter::_default_type_.get());
  ::memset(&value_, 0, reinterpret_cast<char*>(&variance_norm_) -
    reinterpret_cast<char*>(&value_) + sizeof(variance_norm_));
  sparse_ = -1;
  max_ = 1;
  std_ = 1;
}